

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * util::text_cap(string *__return_storage_ptr__,string *string,int width,string *elipses)

{
  pointer pcVar1;
  int iVar2;
  size_type sVar3;
  int iVar4;
  size_type sVar5;
  bool bVar6;
  
  if (string->_M_string_length == 0) {
LAB_001926eb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (string->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + string->_M_string_length);
    return __return_storage_ptr__;
  }
  pcVar1 = (string->_M_dataplus)._M_p;
  iVar2 = 0;
  sVar3 = 0;
  while (iVar2 = iVar2 + *(int *)(sizes + (ulong)(byte)pcVar1[sVar3] * 4), iVar2 <= width) {
    sVar3 = sVar3 + 1;
    if (string->_M_string_length == sVar3) goto LAB_001926eb;
  }
  if (elipses->_M_string_length == 0) {
    iVar4 = 0;
  }
  else {
    sVar5 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + *(int *)(sizes + (ulong)(byte)(elipses->_M_dataplus)._M_p[sVar5] * 4);
      sVar5 = sVar5 + 1;
    } while (elipses->_M_string_length != sVar5);
  }
  if (sVar3 != 0 && iVar4 + width < iVar2) {
    do {
      iVar2 = iVar2 - pcVar1[sVar3];
      if (iVar2 <= iVar4 + width) break;
      bVar6 = sVar3 != 1;
      sVar3 = sVar3 - 1;
    } while (bVar6);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)string);
  return __return_storage_ptr__;
}

Assistant:

std::string text_cap(const std::string& string, int width, const std::string& elipses)
{
	int length = 0;

	for (std::size_t i = 0; i < string.length(); ++i)
	{
		length += sizes[string[i] & 0xFF];

		if (length > width)
		{
			int elipses_length = text_width(elipses);

			while (length > (width + elipses_length) && i > 0)
			{
				length -= string[i];
				--i;
			}

			return string.substr(0, i);
		}
	}

	return string;
}